

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

int hmacReset(HMACContext *ctx,SHAversion whichSha,uchar *key,int key_len)

{
  uint bytecount;
  int iVar1;
  int iVar2;
  bool local_1e6;
  bool local_1e5;
  undefined1 local_1e0 [4];
  int err;
  USHAContext tctx;
  uchar tempkey [64];
  uchar k_ipad [128];
  int hashsize;
  int blocksize;
  int i;
  int key_len_local;
  uchar *key_local;
  SHAversion whichSha_local;
  HMACContext *ctx_local;
  
  if (ctx == (HMACContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    bytecount = USHABlockSize(whichSha);
    ctx->blockSize = bytecount;
    iVar1 = USHAHashSize(whichSha);
    ctx->hashSize = iVar1;
    ctx->whichSha = whichSha;
    blocksize = key_len;
    _i = key;
    if ((int)bytecount < key_len) {
      iVar2 = USHAReset((USHAContext *)local_1e0,whichSha);
      local_1e5 = true;
      if (iVar2 == 0) {
        iVar2 = USHAInput((USHAContext *)local_1e0,key,key_len);
        local_1e5 = true;
        if (iVar2 == 0) {
          iVar2 = USHAResult((USHAContext *)local_1e0,(uint8_t *)&tctx.ctx.sha384Context.Corrupted);
          local_1e5 = iVar2 != 0;
        }
      }
      if (local_1e5 != 0) {
        return (uint)local_1e5;
      }
      _i = (uchar *)((long)&tctx.ctx + 0xd8);
      blocksize = iVar1;
    }
    for (hashsize = 0; hashsize < blocksize; hashsize = hashsize + 1) {
      tempkey[(long)hashsize + 0x38] = _i[hashsize] ^ 0x36;
      ctx->k_opad[hashsize] = _i[hashsize] ^ 0x5c;
    }
    for (; hashsize < (int)bytecount; hashsize = hashsize + 1) {
      tempkey[(long)hashsize + 0x38] = '6';
      ctx->k_opad[hashsize] = '\\';
    }
    iVar1 = USHAReset(&ctx->shaContext,whichSha);
    local_1e6 = true;
    if (iVar1 == 0) {
      iVar1 = USHAInput(&ctx->shaContext,tempkey + 0x38,bytecount);
      local_1e6 = iVar1 != 0;
    }
    ctx_local._4_4_ = (uint)local_1e6;
  }
  return ctx_local._4_4_;
}

Assistant:

int hmacReset(HMACContext *ctx, enum SHAversion whichSha,
    const unsigned char *key, int key_len)
{
    int i, blocksize, hashsize;

    /* inner padding - key XORd with ipad */
    unsigned char k_ipad[USHA_Max_Message_Block_Size];

    /* temporary buffer when keylen > blocksize */
    unsigned char tempkey[USHAMaxHashSize];

    if (!ctx) return shaNull;

    blocksize = ctx->blockSize = USHABlockSize(whichSha);
    hashsize = ctx->hashSize = USHAHashSize(whichSha);

    ctx->whichSha = whichSha;

    /*
    * If key is longer than the hash blocksize,
    * reset it to key = HASH(key).
    */
    if (key_len > blocksize) {
        USHAContext tctx;
        int err = USHAReset(&tctx, whichSha) ||
            USHAInput(&tctx, key, key_len) ||
            USHAResult(&tctx, tempkey);
        if (err != shaSuccess) return err;

        key = tempkey;
        key_len = hashsize;
    }

    /*
    * The HMAC transform looks like:
    *
    * SHA(K XOR opad, SHA(K XOR ipad, text))
    *
    * where K is an n byte key.
    * ipad is the byte 0x36 repeated blocksize times
    * opad is the byte 0x5c repeated blocksize times
    * and text is the data being protected.
    */

    /* store key into the pads, XOR'd with ipad and opad values */
    for (i = 0; i < key_len; i++) {
        k_ipad[i] = key[i] ^ 0x36;
        ctx->k_opad[i] = key[i] ^ 0x5c;
    }
    /* remaining pad bytes are '\0' XOR'd with ipad and opad values */
    for (; i < blocksize; i++) {
        k_ipad[i] = 0x36;
        ctx->k_opad[i] = 0x5c;
    }

    /* perform inner hash */
    /* init context for 1st pass */
    return USHAReset(&ctx->shaContext, whichSha) ||
        /* and start with inner pad */
        USHAInput(&ctx->shaContext, k_ipad, blocksize);
}